

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  long lVar2;
  CoverageBinsSyntax *pCVar3;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_RBX;
  Token TVar4;
  BumpAllocator *unaff_retaddr;
  Token *in_stack_00000030;
  CoverageBinInitializerSyntax *in_stack_00000038;
  CoverageIffClauseSyntax **in_stack_00000040;
  Token *in_stack_00000048;
  BumpAllocator *in_stack_00000088;
  Token *in_stack_00000090;
  BumpAllocator *in_stack_ffffffffffffff38;
  CoverageIffClauseSyntax *in_stack_ffffffffffffff40;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
             (BumpAllocator *)__child_stack);
  TVar4 = parsing::Token::deepClone(in_stack_00000090,in_stack_00000088);
  parsing::Token::deepClone(in_stack_00000090,in_stack_00000088);
  parsing::Token::deepClone(in_stack_00000090,in_stack_00000088);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x80))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x80))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x80))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x80))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::CoverageBinsArraySizeSyntax>
              ((CoverageBinsArraySizeSyntax *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  parsing::Token::deepClone(in_stack_00000090,in_stack_00000088);
  not_null<slang::syntax::CoverageBinInitializerSyntax_*>::operator*
            ((not_null<slang::syntax::CoverageBinInitializerSyntax_*> *)0xa30750);
  deepClone<slang::syntax::CoverageBinInitializerSyntax>
            ((CoverageBinInitializerSyntax *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  lVar2._0_2_ = ((Token *)((long)__fn + 0xa0))->kind;
  lVar2._2_1_ = ((Token *)((long)__fn + 0xa0))->field_0x2;
  lVar2._3_1_ = ((Token *)((long)__fn + 0xa0))->numFlags;
  lVar2._4_4_ = ((Token *)((long)__fn + 0xa0))->rawLen;
  if (lVar2 != 0) {
    deepClone<slang::syntax::CoverageIffClauseSyntax>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  parsing::Token::deepClone(in_stack_00000090,in_stack_00000088);
  pCVar3 = BumpAllocator::
           emplace<slang::syntax::CoverageBinsSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::CoverageBinsArraySizeSyntax*,slang::parsing::Token,slang::syntax::CoverageBinInitializerSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token>
                     (unaff_retaddr,unaff_RBX,(Token *)__fn,(Token *)__child_stack,
                      (Token *)TVar4.info,TVar4._0_8_,in_stack_00000030,in_stack_00000038,
                      in_stack_00000040,in_stack_00000048);
  return (int)pCVar3;
}

Assistant:

static SyntaxNode* clone(const CoverageBinsSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverageBinsSyntax>(
        *deepClone(node.attributes, alloc),
        node.wildcard.deepClone(alloc),
        node.keyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.size ? deepClone(*node.size, alloc) : nullptr,
        node.equals.deepClone(alloc),
        *deepClone<CoverageBinInitializerSyntax>(*node.initializer, alloc),
        node.iff ? deepClone(*node.iff, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}